

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall QLocalServer::listen(QLocalServer *this,int __fd,int __n)

{
  QLocalServerPrivate *this_00;
  QArrayData *pQVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  QLocalServerPrivate *d;
  
  this_00 = *(QLocalServerPrivate **)&this->field_0x8;
  if ((this_00->serverName).d.size == 0) {
    if ((this_00->serverName).d.ptr != (char16_t *)0x0) {
      pQVar1 = &((this_00->serverName).d.d)->super_QArrayData;
      (this_00->serverName).d.d = (Data *)0x0;
      (this_00->serverName).d.ptr = (char16_t *)0x0;
      (this_00->serverName).d.size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
          __n = extraout_EDX;
        }
      }
    }
    if ((this_00->fullServerName).d.ptr != (char16_t *)0x0) {
      pQVar1 = &((this_00->fullServerName).d.d)->super_QArrayData;
      (this_00->fullServerName).d.d = (Data *)0x0;
      (this_00->fullServerName).d.ptr = (char16_t *)0x0;
      (this_00->fullServerName).d.size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
          __n = extraout_EDX_00;
        }
      }
    }
    iVar2 = QLocalServerPrivate::listen(this_00,__fd,__n);
    return iVar2;
  }
  listen((int)this,__fd);
  return 0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }